

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

uint __thiscall llvm::yaml::Scanner::scanBlockIndentationIndicator(Scanner *this)

{
  char cVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((this->Current != this->End) && (cVar1 = *this->Current, uVar2 = 0, (byte)(cVar1 - 0x31U) < 9)
     ) {
    uVar2 = (uint)(byte)(cVar1 - 0x30);
    skip(this,1);
  }
  return uVar2;
}

Assistant:

unsigned Scanner::scanBlockIndentationIndicator() {
  unsigned Indent = 0;
  if (Current != End && (*Current >= '1' && *Current <= '9')) {
    Indent = unsigned(*Current - '0');
    skip(1);
  }
  return Indent;
}